

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O0

void __thiscall cppnet::RWSocket::Disconnect(RWSocket *this)

{
  bool bVar1;
  element_type *this_00;
  Event *pEVar2;
  element_type *peVar3;
  undefined1 local_50 [8];
  shared_ptr<cppnet::EventActions> actions;
  enable_shared_from_this<cppnet::RWSocket> local_30;
  shared_ptr<cppnet::Socket> local_20;
  element_type *local_10;
  RWSocket *this_local;
  
  local_10 = (element_type *)this;
  if (this->_event == (Event *)0x0) {
    this_00 = std::
              __shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_alloter);
    pEVar2 = AlloterWrap::PoolNew<cppnet::Event>(this_00);
    this->_event = pEVar2;
    pEVar2 = this->_event;
    std::enable_shared_from_this<cppnet::RWSocket>::shared_from_this(&local_30);
    std::shared_ptr<cppnet::Socket>::shared_ptr<cppnet::RWSocket,void>
              (&local_20,(shared_ptr<cppnet::RWSocket> *)&local_30);
    Event::SetSocket(pEVar2,&local_20);
    std::shared_ptr<cppnet::Socket>::~shared_ptr(&local_20);
    std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)&local_30);
  }
  Socket::GetEventActions((Socket *)local_50);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
    (*peVar3->_vptr_EventActions[8])(peVar3,this->_event);
  }
  std::shared_ptr<cppnet::EventActions>::~shared_ptr((shared_ptr<cppnet::EventActions> *)local_50);
  return;
}

Assistant:

void RWSocket::Disconnect() {
    if (!_event) {
        _event = _alloter->PoolNew<Event>();
        _event->SetSocket(shared_from_this());
    }

    auto actions = GetEventActions();
    if (actions) {
        actions->AddDisconnection(_event);
    }
}